

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<CTxIn,std::allocator<CTxIn>>>
          (VectorFormatter<DefaultFormatter> *this,
          ParamsStream<SizeComputer_&,_TransactionSerParams> *s,
          vector<CTxIn,_std::allocator<CTxIn>_> *v)

{
  long lVar1;
  pointer pCVar2;
  SizeComputer *pSVar3;
  size_t sVar4;
  pointer pCVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<ParamsStream<SizeComputer&,TransactionSerParams>>
            (s,((long)(v->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(v->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
  pCVar5 = (v->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pCVar2 = (v->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pCVar5 != pCVar2) {
    pSVar3 = s->m_substream;
    sVar4 = pSVar3->nSize;
    do {
      pSVar3->nSize = sVar4 + 0x24;
      SerializeMany<ParamsStream<SizeComputer&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
                (s,&(pCVar5->scriptSig).super_CScriptBase);
      pSVar3 = s->m_substream;
      sVar4 = pSVar3->nSize + 4;
      pSVar3->nSize = sVar4;
      pCVar5 = pCVar5 + 1;
    } while (pCVar5 != pCVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }